

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::anon_unknown_26::Register(ExtensionInfo *info)

{
  __node_base *p_Var1;
  size_type *psVar2;
  __node_base _Var3;
  _Hash_node_base *p_Var4;
  int iVar5;
  __node_ptr p_Var6;
  LogMessage *pLVar7;
  __node_ptr p_Var8;
  __node_base_ptr *pp_Var9;
  __node_base_ptr *pp_Var10;
  unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *puVar11;
  ulong uVar12;
  size_t __bkt_count;
  ulong uVar13;
  __node_base _Var14;
  ulong __c;
  undefined1 auVar15 [16];
  LogFinisher local_91;
  size_t local_90;
  string local_88;
  unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *local_68;
  __node_ptr local_60;
  
  if ((anonymous_namespace)::Register(google::protobuf::internal::ExtensionInfo_const&)::
      local_static_registry == '\0') {
    iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 Register(google::protobuf::internal::ExtensionInfo_const&)::
                                 local_static_registry);
    if (iVar5 != 0) {
      puVar11 = (unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                 *)operator_new(0x38);
      (puVar11->_M_h)._M_buckets = &(puVar11->_M_h)._M_single_bucket;
      (puVar11->_M_h)._M_bucket_count = 1;
      (puVar11->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (puVar11->_M_h)._M_element_count = 0;
      (puVar11->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
      (puVar11->_M_h)._M_rehash_policy._M_next_resize = 0;
      (puVar11->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      OnShutdownRun(OnShutdownDelete<std::unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>_>
                    ::anon_class_1_0_00000001::__invoke,puVar11);
      Register::local_static_registry = puVar11;
      __cxa_guard_release(&(anonymous_namespace)::
                           Register(google::protobuf::internal::ExtensionInfo_const&)::
                           local_static_registry);
    }
  }
  puVar11 = Register::local_static_registry;
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  __c = (long)info->number ^ (ulong)info->message;
  uVar12 = __c % (Register::local_static_registry->_M_h)._M_bucket_count;
  p_Var6 = std::
           _Hashtable<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::ExtensionInfo,_std::allocator<google::protobuf::internal::ExtensionInfo>,_std::__detail::_Identity,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_node(&Register::local_static_registry->_M_h,uVar12,info,__c);
  if (p_Var6 == (__node_ptr)0x0) {
    p_Var8 = std::__detail::
             _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<google::protobuf::internal::ExtensionInfo,true>>>
             ::_M_allocate_node<google::protobuf::internal::ExtensionInfo_const&>
                       ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<google::protobuf::internal::ExtensionInfo,true>>>
                         *)puVar11,info);
    local_68 = puVar11;
    local_90 = (puVar11->_M_h)._M_rehash_policy._M_next_resize;
    local_60 = p_Var8;
    auVar15 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(puVar11->_M_h)._M_rehash_policy,(puVar11->_M_h)._M_bucket_count,
                         (puVar11->_M_h)._M_element_count);
    __bkt_count = auVar15._8_8_;
    if ((auVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pp_Var9 = (puVar11->_M_h)._M_buckets;
    }
    else {
      if (__bkt_count == 1) {
        pp_Var9 = &(puVar11->_M_h)._M_single_bucket;
        (puVar11->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        pp_Var9 = std::__detail::
                  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<google::protobuf::internal::ExtensionInfo,_true>_>_>
                  ::_M_allocate_buckets
                            ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<google::protobuf::internal::ExtensionInfo,_true>_>_>
                              *)puVar11,__bkt_count);
      }
      p_Var1 = &(puVar11->_M_h)._M_before_begin;
      _Var3._M_nxt = (puVar11->_M_h)._M_before_begin._M_nxt;
      (puVar11->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      uVar12 = 0;
LAB_003be229:
      _Var14._M_nxt = _Var3._M_nxt;
      uVar13 = uVar12;
      if (_Var14._M_nxt != (_Hash_node_base *)0x0) {
        _Var3._M_nxt = (_Var14._M_nxt)->_M_nxt;
        uVar12 = (ulong)_Var14._M_nxt[6]._M_nxt % __bkt_count;
        if (pp_Var9[uVar12] == (__node_base_ptr)0x0) goto LAB_003be258;
        (_Var14._M_nxt)->_M_nxt = pp_Var9[uVar12]->_M_nxt;
        pp_Var10 = &pp_Var9[uVar12]->_M_nxt;
        uVar12 = uVar13;
        goto LAB_003be26f;
      }
      std::
      _Hashtable<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::ExtensionInfo,_std::allocator<google::protobuf::internal::ExtensionInfo>,_std::__detail::_Identity,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_M_deallocate_buckets(&puVar11->_M_h);
      (puVar11->_M_h)._M_bucket_count = __bkt_count;
      (puVar11->_M_h)._M_buckets = pp_Var9;
      uVar12 = __c % __bkt_count;
    }
    (p_Var8->super__Hash_node_value<google::protobuf::internal::ExtensionInfo,_true>).
    super__Hash_node_code_cache<true>._M_hash_code = __c;
    if (pp_Var9[uVar12] == (__node_base_ptr)0x0) {
      (p_Var8->super__Hash_node_base)._M_nxt = (puVar11->_M_h)._M_before_begin._M_nxt;
      (puVar11->_M_h)._M_before_begin._M_nxt = &p_Var8->super__Hash_node_base;
      p_Var4 = (p_Var8->super__Hash_node_base)._M_nxt;
      if (p_Var4 != (_Hash_node_base *)0x0) {
        pp_Var9[(ulong)p_Var4[6]._M_nxt % (puVar11->_M_h)._M_bucket_count] =
             &p_Var8->super__Hash_node_base;
        pp_Var9 = (puVar11->_M_h)._M_buckets;
      }
      pp_Var9[uVar12] = &(puVar11->_M_h)._M_before_begin;
    }
    else {
      (p_Var8->super__Hash_node_base)._M_nxt = pp_Var9[uVar12]->_M_nxt;
      pp_Var9[uVar12]->_M_nxt = &p_Var8->super__Hash_node_base;
    }
    psVar2 = &(puVar11->_M_h)._M_element_count;
    *psVar2 = *psVar2 + 1;
    local_60 = (__node_ptr)0x0;
    std::
    _Hashtable<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::ExtensionInfo,_std::allocator<google::protobuf::internal::ExtensionInfo>,_std::__detail::_Identity,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_Scoped_node::~_Scoped_node((_Scoped_node *)&local_68);
  }
  else {
    LogMessage::LogMessage
              ((LogMessage *)&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x75);
    pLVar7 = LogMessage::operator<<
                       ((LogMessage *)&local_68,"Multiple extension registrations for type \"");
    (*info->message->_vptr_MessageLite[2])(&local_88);
    pLVar7 = LogMessage::operator<<(pLVar7,&local_88);
    pLVar7 = LogMessage::operator<<(pLVar7,"\", field number ");
    pLVar7 = LogMessage::operator<<(pLVar7,info->number);
    pLVar7 = LogMessage::operator<<(pLVar7,".");
    LogFinisher::operator=(&local_91,pLVar7);
    std::__cxx11::string::~string((string *)&local_88);
    LogMessage::~LogMessage((LogMessage *)&local_68);
  }
  return;
LAB_003be258:
  (_Var14._M_nxt)->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = _Var14._M_nxt;
  pp_Var9[uVar12] = p_Var1;
  if ((_Var14._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var10 = pp_Var9 + uVar13;
LAB_003be26f:
    *pp_Var10 = _Var14._M_nxt;
  }
  goto LAB_003be229;
}

Assistant:

void Register(const ExtensionInfo& info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!InsertIfNotPresent(local_static_registry, info)) {
    GOOGLE_LOG(FATAL) << "Multiple extension registrations for type \""
               << info.message->GetTypeName() << "\", field number "
               << info.number << ".";
  }
}